

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::raft_server(raft_server *this,context *ctx,init_options *opt)

{
  ptr<srv_state> *ppVar1;
  ptr<log_store> *ppVar2;
  _Rb_tree_header *p_Var3;
  char cVar4;
  undefined1 uVar5;
  __int_type_conflict1 _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  __int_type _Var8;
  element_type *peVar9;
  element_type *peVar10;
  undefined8 uVar11;
  int iVar12;
  uint32_t uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EventAwaiter *pEVar14;
  undefined8 *puVar15;
  long lVar16;
  undefined1 *puVar17;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  ostream *poVar19;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ostream *poVar20;
  long *plVar21;
  srv_state *__tmp;
  element_type *peVar22;
  char *pcVar23;
  ulong uVar24;
  bool bVar25;
  default_random_engine engine;
  ptr<srv_config> cur_srv;
  ptr<raft_params> params;
  uniform_int_distribution<int> distribution;
  ptr<cluster_config> c_conf;
  stringstream peer_info_msg;
  stringstream init_msg;
  undefined1 local_431;
  ptr<logger> *local_430;
  _Any_data local_428;
  code *local_418;
  code *pcStack_410;
  shared_ptr<nuraft::srv_config> local_400;
  init_options *local_3f0;
  peer *local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3e0;
  unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *local_3d8;
  _Hashtable<int,std::pair<int_const,std::shared_ptr<nuraft::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_3d0;
  undefined1 local_3c8 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_390;
  list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  *local_388;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_380;
  condition_variable *local_378;
  undefined1 local_370 [48];
  undefined1 local_340 [128];
  ios_base aiStack_2c0 [264];
  undefined1 local_1b8 [128];
  ios_base aiStack_138 [264];
  
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_raft_server = (_func_int **)&PTR__raft_server_005bd938;
  (this->bg_commit_thread_)._M_id._M_thread = 0;
  (this->bg_append_thread_)._M_id._M_thread = 0;
  *(undefined8 *)((long)&(this->bg_append_thread_)._M_id._M_thread + 1) = 0;
  *(undefined8 *)((long)&this->bg_append_ea_ + 1) = 0;
  (this->leader_).super___atomic_base<int>._M_i = -1;
  local_3f0 = opt;
  iVar12 = (*((ctx->state_mgr_).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_vptr_state_mgr[7])();
  this->id_ = iVar12;
  this->target_priority_ = 1;
  (this->priority_change_timer_).t_created_.__d.__r = 0;
  (this->priority_change_timer_).duration_us_ = 0;
  (this->priority_change_timer_).first_event_fired_ = true;
  (this->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10) =
       0;
  (this->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->priority_change_timer_);
  this->votes_responded_ = 0;
  this->votes_granted_ = 0;
  (this->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  iVar12 = (*((ctx->state_machine_).
              super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_state_machine[0x11])();
  (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i =
       CONCAT44(extraout_var,iVar12);
  iVar12 = (*((ctx->state_machine_).
              super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_state_machine[0x11])();
  (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i =
       CONCAT44(extraout_var_00,iVar12);
  iVar12 = (*((ctx->state_machine_).
              super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_state_machine[0x11])();
  this->initial_commit_index_ = CONCAT44(extraout_var_01,iVar12);
  (this->hb_alive_)._M_base._M_i = false;
  (this->pre_vote_).quorum_reject_count_ = (__atomic_base<int>)0x0;
  (this->pre_vote_).failure_count_ = (__atomic_base<int>)0x0;
  (this->pre_vote_).term_ = 0;
  LOCK();
  (this->pre_vote_).done_._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).dead_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).live_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  this->election_completed_ = true;
  this->config_changing_ = false;
  this->catching_up_ = (__atomic_base<bool>)0x0;
  this->out_of_log_range_ = (__atomic_base<bool>)0x0;
  this->data_fresh_ = (__atomic_base<bool>)0x0;
  this->stopping_ = (__atomic_base<bool>)0x0;
  this->commit_bg_stopped_ = (__atomic_base<bool>)0x0;
  this->append_bg_stopped_ = (__atomic_base<bool>)0x0;
  this->write_paused_ = (__atomic_base<bool>)0x0;
  this->sm_commit_paused_ = (__atomic_base<bool>)0x0;
  this->sm_commit_exec_in_progress_ = (__atomic_base<bool>)0x0;
  pEVar14 = (EventAwaiter *)operator_new(0x60);
  (pEVar14->status)._M_i = idle;
  (pEVar14->cvLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pEVar14->cvLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pEVar14->cvLock).super___mutex_base._M_mutex + 0x10) = 0;
  (pEVar14->cvLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pEVar14->cvLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&pEVar14->cv);
  this->ea_sm_commit_exec_in_progress_ = pEVar14;
  (this->next_leader_candidate_).super___atomic_base<int>._M_i = -1;
  (this->reelection_timer_).t_created_.__d.__r = 0;
  (this->reelection_timer_).duration_us_ = 0;
  (this->reelection_timer_).first_event_fired_ = true;
  (this->reelection_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->reelection_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->reelection_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->reelection_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->reelection_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->reelection_timer_);
  this->im_learner_ = false;
  this->serving_req_ = (__atomic_base<bool>)0x0;
  this->steps_to_down_ = 0;
  (this->snp_in_progress_)._M_base._M_i = false;
  (this->ctx_)._M_t.super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
  _M_t.super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
  super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl = ctx;
  (this->scheduler_).super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (ctx->scheduler_).
           super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var7 = (ctx->scheduler_).
           super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->scheduler_).super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var7;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_3d8 = &this->ctx_;
  (this->election_exec_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->election_exec_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->election_exec_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->election_exec_).super__Function_base._M_functor + 8) = 0;
  puVar15 = (undefined8 *)operator_new(0x18);
  *puVar15 = handle_election_timeout;
  puVar15[1] = 0;
  puVar15[2] = this;
  *(undefined8 **)&(this->election_exec_).super__Function_base._M_functor = puVar15;
  (this->election_exec_)._M_invoker =
       std::
       _Function_handler<void_(),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*))()>_>
       ::_M_invoke;
  (this->election_exec_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*))()>_>
       ::_M_manager;
  (this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->last_election_timer_reset_).t_created_.__d.__r = 0;
  (this->last_election_timer_reset_).duration_us_ = 0;
  (this->last_election_timer_reset_).first_event_fired_ = true;
  (this->last_election_timer_reset_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->last_election_timer_reset_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)
   ((long)&(this->last_election_timer_reset_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->last_election_timer_reset_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->last_election_timer_reset_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->last_election_timer_reset_);
  local_3d0 = (_Hashtable<int,std::pair<int_const,std::shared_ptr<nuraft::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)&this->peers_;
  (this->peers_)._M_h._M_buckets = &(this->peers_)._M_h._M_single_bucket;
  (this->peers_)._M_h._M_bucket_count = 1;
  (this->peers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->peers_)._M_h._M_element_count = 0;
  (this->peers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->peers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->peers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->rpc_clients_)._M_h._M_buckets = &(this->rpc_clients_)._M_h._M_single_bucket;
  (this->rpc_clients_)._M_h._M_bucket_count = 1;
  (this->rpc_clients_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rpc_clients_)._M_h._M_element_count = 0;
  (this->rpc_clients_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rpc_clients_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rpc_clients_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->auto_fwd_pkgs_)._M_h._M_buckets = &(this->auto_fwd_pkgs_)._M_h._M_single_bucket;
  (this->auto_fwd_pkgs_)._M_h._M_bucket_count = 1;
  (this->auto_fwd_pkgs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->auto_fwd_pkgs_)._M_h._M_element_count = 0;
  (this->auto_fwd_pkgs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->auto_fwd_pkgs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->auto_fwd_pkgs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_388 = &this->auto_fwd_reqs_;
  (this->auto_fwd_reqs_).
  super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_388;
  (this->auto_fwd_reqs_).
  super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_388;
  (this->auto_fwd_reqs_).
  super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ._M_impl._M_node._M_size = 0;
  (this->auto_fwd_reqs_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->auto_fwd_reqs_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->auto_fwd_reqs_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->auto_fwd_reqs_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->auto_fwd_reqs_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->role_)._M_i = follower;
  ppVar1 = &this->state_;
  (*((ctx->state_mgr_).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_state_mgr[5])(ppVar1);
  ppVar2 = &this->log_store_;
  (*((ctx->state_mgr_).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_state_mgr[6])(ppVar2);
  (this->state_machine_).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (ctx->state_machine_).
           super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var7 = (ctx->state_machine_).
           super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->state_machine_).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var7;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  (this->receiving_snapshot_)._M_base._M_i = false;
  (this->et_cnt_receiving_snapshot_).super___atomic_base<unsigned_long>._M_i = 0;
  this->first_snapshot_distance_ = 0;
  (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ctx->logger_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var7 = (ctx->logger_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var7;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  (this->stale_config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->stale_config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->rand_timeout_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->rand_timeout_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->rand_timeout_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->rand_timeout_).super__Function_base._M_functor + 8) = 0;
  (*((ctx->state_mgr_).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_state_mgr[2])(&this->config_);
  *(undefined8 *)
   ((long)&(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 1) = 0;
  *(undefined8 *)
   ((long)&(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  (this->uncommitted_config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->config_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->uncommitted_config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  *(undefined8 *)((long)&(this->config_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->config_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->config_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->config_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock_).super___recursive_mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock_).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->srv_to_leave_target_idx_ = 0;
  (this->conf_to_add_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->conf_to_add_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__align = 0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (this->cli_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cli_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->cli_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->cli_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->cli_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_378 = &this->commit_cv_;
  std::condition_variable::condition_variable(local_378);
  p_Var3 = &(this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header;
  (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->commit_cv_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->commit_cv_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->commit_cv_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->commit_cv_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->commit_cv_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->commit_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->commit_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->commit_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->commit_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->commit_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->rpc_clients_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->rpc_clients_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->rpc_clients_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->rpc_clients_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->rpc_clients_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  local_380._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->ready_to_stop_cv_;
  (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->commit_ret_elems_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->commit_ret_elems_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->commit_ret_elems_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->commit_ret_elems_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->commit_ret_elems_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable((condition_variable *)local_380._M_pi);
  (this->resp_handler_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)((long)&(this->resp_handler_).super__Function_base._M_functor + 8) = 0;
  (this->resp_handler_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ready_to_stop_cv_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)&(this->resp_handler_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ready_to_stop_cv_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->ready_to_stop_cv_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->ready_to_stop_cv_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->ready_to_stop_cv_lock_).super___mutex_base._M_mutex + 8) = 0;
  puVar15 = (undefined8 *)operator_new(0x18);
  *puVar15 = handle_peer_resp;
  puVar15[1] = 0;
  puVar15[2] = this;
  *(undefined8 **)&(this->resp_handler_).super__Function_base._M_functor = puVar15;
  (this->resp_handler_)._M_invoker =
       std::
       _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
       ::_M_invoke;
  (this->resp_handler_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
       ::_M_manager;
  *(undefined8 *)&(this->ex_resp_handler_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ex_resp_handler_).super__Function_base._M_functor + 8) = 0;
  (this->ex_resp_handler_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ex_resp_handler_)._M_invoker = (_Invoker_type)0x0;
  puVar15 = (undefined8 *)operator_new(0x18);
  *puVar15 = handle_ext_resp;
  puVar15[1] = 0;
  puVar15[2] = this;
  *(undefined8 **)&(this->ex_resp_handler_).super__Function_base._M_functor = puVar15;
  (this->ex_resp_handler_)._M_invoker =
       std::
       _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
       ::_M_invoke;
  (this->ex_resp_handler_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
       ::_M_manager;
  (*((ctx->state_machine_).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_state_machine[0x10])(&this->last_snapshot_);
  (this->last_snapshot_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->leadership_transfer_timer_).t_created_.__d.__r = 0;
  *(undefined8 *)((long)&(this->last_snapshot_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->last_snapshot_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->last_snapshot_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->last_snapshot_lock_).super___mutex_base._M_mutex + 8) = 0;
  (this->leadership_transfer_timer_).duration_us_ = 0;
  (this->leadership_transfer_timer_).first_event_fired_ = true;
  (this->leadership_transfer_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->leadership_transfer_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)
   ((long)&(this->leadership_transfer_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->leadership_transfer_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->leadership_transfer_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->leadership_transfer_timer_);
  (this->status_check_timer_).t_created_.__d.__r = 0;
  (this->status_check_timer_).duration_us_ = 0;
  (this->status_check_timer_).first_event_fired_ = true;
  (this->status_check_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->status_check_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->status_check_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->status_check_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->status_check_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->status_check_timer_);
  (this->vote_init_timer_).t_created_.__d.__r = 0;
  (this->vote_init_timer_).duration_us_ = 0;
  (this->vote_init_timer_).first_event_fired_ = true;
  (this->vote_init_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->vote_init_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->vote_init_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->vote_init_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->vote_init_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->vote_init_timer_);
  pEVar14 = (EventAwaiter *)operator_new(0x60);
  (pEVar14->status)._M_i = idle;
  (pEVar14->cvLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pEVar14->cvLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pEVar14->cvLock).super___mutex_base._M_mutex + 0x10) = 0;
  (pEVar14->cvLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pEVar14->cvLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&pEVar14->cv);
  this->ea_follower_log_append_ = pEVar14;
  (this->test_mode_flag_)._M_base._M_i = local_3f0->test_mode_flag_;
  if ((local_3f0->raft_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>::
    function((function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>
              *)(local_370 + 0x10),&local_3f0->raft_callback_);
    context::set_cb_func(ctx,(func_type *)(local_370 + 0x10));
    if ((code *)local_370._32_8_ != (code *)0x0) {
      (*(code *)local_370._32_8_)(local_370 + 0x10,local_370 + 0x10,3);
    }
  }
  context::get_params((context *)local_3c8);
  if (*(int *)((long)&((element_type *)(local_3c8._0_8_ + 0x30))->_vptr_state_mgr + 4) <
      *(int *)&((element_type *)(local_3c8._0_8_ + 0x30))->_vptr_state_mgr) {
    *(int *)((long)&((element_type *)(local_3c8._0_8_ + 0x30))->_vptr_state_mgr + 4) =
         *(int *)&((element_type *)(local_3c8._0_8_ + 0x30))->_vptr_state_mgr;
  }
  cVar4 = *(char *)&((element_type *)(local_3c8._0_8_ + 0x20))->_vptr_state_mgr;
  if (cVar4 == '\x01') {
    get_last_snapshot((raft_server *)local_370);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._0_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar25 = 1 < *(int *)&((element_type *)(local_3c8._0_8_ + 0x18))->_vptr_state_mgr;
      goto LAB_001abee4;
    }
  }
  bVar25 = false;
LAB_001abee4:
  if ((cVar4 != '\0') && ((element_type *)local_370._8_8_ != (element_type *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._8_8_);
  }
  if (bVar25) {
    lVar16 = std::chrono::_V2::system_clock::now();
    puVar17 = local_340 + 7;
    local_340._0_8_ = (_Invoker_type)((long)this->id_ * (lVar16 / 1000));
    lVar16 = 0;
    do {
      uVar5 = local_340[lVar16];
      local_340[lVar16] = *puVar17;
      lVar16 = lVar16 + 1;
      *puVar17 = uVar5;
      puVar17 = puVar17 + -1;
    } while (lVar16 != 4);
    local_428._M_unused._0_8_ =
         (undefined8)
         ((ulong)local_340._0_8_ % 0x7fffffff + (ulong)((ulong)local_340._0_8_ % 0x7fffffff == 0));
    local_3c8._16_4_ = *(int *)&((element_type *)(local_3c8._0_8_ + 0x18))->_vptr_state_mgr / 2;
    local_3c8._20_4_ = *(int *)&((element_type *)(local_3c8._0_8_ + 0x18))->_vptr_state_mgr + -1;
    if ((int)local_3c8._20_4_ < (int)local_3c8._16_4_) {
      local_3c8._20_4_ = local_3c8._16_4_;
    }
    uVar13 = std::uniform_int_distribution<int>::operator()
                       ((uniform_int_distribution<int> *)(local_3c8 + 0x10),
                        (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                        &local_428,(param_type *)(local_3c8 + 0x10));
    this->first_snapshot_distance_ = uVar13;
    peVar22 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar22 != (element_type *)0x0) {
      iVar12 = (**(code **)(*(long *)peVar22 + 0x38))();
      if (3 < iVar12) {
        peVar22 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_1b8,"First snapshot creation log distance %u",
                   (ulong)this->first_snapshot_distance_);
        (**(code **)(*(long *)peVar22 + 0x40))
                  (peVar22,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"raft_server",0x89,local_1b8);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_);
        }
      }
    }
  }
  apply_and_log_current_params(this);
  update_rand_timeout(this);
  iVar12 = (*((ppVar2->super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             _vptr_log_store[2])();
  LOCK();
  (this->precommit_index_).super___atomic_base<unsigned_long>._M_i =
       CONCAT44(extraout_var_02,iVar12) - 1;
  UNLOCK();
  iVar12 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_vptr_log_store[2])();
  LOCK();
  (this->lagging_sm_target_index_).super___atomic_base<unsigned_long>._M_i =
       CONCAT44(extraout_var_03,iVar12) - 1;
  UNLOCK();
  if ((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
    p_Var18->_M_use_count = 1;
    p_Var18->_M_weak_count = 1;
    p_Var18->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005bcd78;
    *(undefined1 *)&p_Var18[1]._vptr__Sp_counted_base = 1;
    p_Var18[1]._M_use_count = 0;
    p_Var18[1]._M_weak_count = 0;
    *(undefined4 *)&p_Var18[2]._vptr__Sp_counted_base = 0xffffffff;
    *(undefined1 *)((long)&p_Var18[2]._vptr__Sp_counted_base + 4) = 1;
    p_Var18[2]._M_use_count = 0;
    p_Var18[2]._M_weak_count = 0;
    p_Var18[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var18[3]._M_use_count = 0;
    p_Var18[3]._M_weak_count = 0;
    p_Var18[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    (this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var18 + 1);
    p_Var7 = (this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var18;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    LOCK();
    (((ppVar1->super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->term_).
    super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (((ppVar1->super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    voted_for_).super___atomic_base<int>._M_i = -1;
    UNLOCK();
  }
  LOCK();
  (this->vote_init_timer_term_).super___atomic_base<unsigned_long>._M_i =
       (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       term_).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  get_config((raft_server *)(local_3c8 + 0x30));
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar20 = (ostream *)(local_1b8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,"   === INIT RAFT SERVER ===\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,"commit index ",0xd);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"term ",5);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"election timer ",0xf);
  _Var6 = (((ppVar1->super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          election_timer_allowed_)._M_base._M_i;
  pcVar23 = "not allowed";
  if ((_Var6 & 1U) != 0) {
    pcVar23 = "allowed";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar19,pcVar23,(ulong)((byte)~_Var6 & 1) * 4 + 7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"log store start ",0x10);
  (*((ppVar2->super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_log_store[3])();
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,", end ",6);
  (*((ppVar2->super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_log_store[2])();
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"config log idx ",0xf);
  uVar11 = local_3c8._48_8_;
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,", prev log idx ",0xf);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
  if (*(element_type *)(uVar11 + 0x10) == (element_type)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar20," -- ASYNC REPLICATION --\n",0x19);
  }
  local_430 = &this->l_;
  peVar22 = (local_430->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar22 != (element_type *)0x0) {
    iVar12 = (**(code **)(*(long *)peVar22 + 0x38))();
    if (3 < iVar12) {
      peVar22 = (local_430->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::stringbuf::str();
      msg_if_given_abi_cxx11_((string *)local_340,"%s",local_428._M_unused._M_object);
      (**(code **)(*(long *)peVar22 + 0x40))
                (peVar22,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"raft_server",0xa6,local_340);
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_);
      }
      if ((code **)local_428._M_unused._0_8_ != &local_418) {
        operator_delete(local_428._M_unused._M_object);
      }
    }
  }
  _Var8 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
  iVar12 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_vptr_log_store[3])();
  uVar24 = _Var8 + 1;
  if (uVar24 <= CONCAT44(extraout_var_04,iVar12)) {
    uVar24 = CONCAT44(extraout_var_04,iVar12);
  }
  do {
    iVar12 = (*((ppVar2->super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->_vptr_log_store[2])();
    if (CONCAT44(extraout_var_05,iVar12) <= uVar24) {
LAB_001ac4ce:
      std::__cxx11::stringstream::stringstream((stringstream *)local_340);
      peVar22 = *(element_type **)(local_3c8._48_8_ + 0x38);
      if (peVar22 != (element_type *)(local_3c8._48_8_ + 0x38)) {
        do {
          peVar10 = *(element_type **)(peVar22 + 0x10);
          local_400.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar22 + 0x18);
          if (local_400.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_400.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_400.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_400.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_400.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_400.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar10;
          if (peVar10->id_ == this->id_) {
            this->im_learner_ = peVar10->learner_;
            this->my_priority_ = peVar10->priority_;
          }
          else {
            local_418 = (code *)0x0;
            pcStack_410 = (code *)0x0;
            local_428._M_unused._M_object = (void *)0x0;
            local_428._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_428._M_unused._M_object = operator_new(0x18);
            *(code **)local_428._M_unused._0_8_ = handle_hb_timeout;
            *(code **)((long)local_428._M_unused._0_8_ + 8) = (code *)0x0;
            *(raft_server **)((long)local_428._M_unused._0_8_ + 0x10) = this;
            pcStack_410 = std::
                          _Function_handler<void_(int),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>_>
                          ::_M_invoke;
            local_418 = std::
                        _Function_handler<void_(int),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>_>
                        ::_M_manager;
            iVar12 = peVar10->id_;
            local_3e8 = (peer *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<nuraft::peer,std::allocator<nuraft::peer>,std::shared_ptr<nuraft::srv_config>&,nuraft::context&,std::function<void(int)>&,std::shared_ptr<nuraft::logger>&>
                      (&_Stack_3e0,&local_3e8,(allocator<nuraft::peer> *)&local_431,&local_400,
                       (this->ctx_)._M_t.
                       super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                       .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,
                       (function<void_(int)> *)&local_428,local_430);
            local_3c8._24_8_ = local_3e8;
            local_3c8._32_8_ = _Stack_3e0._M_pi;
            local_3e8 = (peer *)0x0;
            _Stack_3e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_3c8._16_4_ = iVar12;
            std::
            _Hashtable<int,std::pair<int_const,std::shared_ptr<nuraft::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<int,std::shared_ptr<nuraft::peer>>>(local_3d0,local_3c8 + 0x10);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._32_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._32_8_);
            }
            if (_Stack_3e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_3e0._M_pi);
            }
            if (local_418 != (code *)0x0) {
              (*local_418)(&local_428,&local_428,3);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_340 + 0x10),"peer ",5);
          poVar20 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)(local_340 + 0x10),
                               (local_400.
                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->id_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,": DC ID ",8);
          poVar20 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar20,
                               (local_400.
                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->dc_id_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar20,((local_400.
                                         super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->endpoint_)._M_dataplus._M_p,
                               ((local_400.
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->endpoint_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          bVar25 = (local_400.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->learner_ != false;
          pcVar23 = "voting member";
          if (bVar25) {
            pcVar23 = "learner";
          }
          lVar16 = 0xd;
          if (bVar25) {
            lVar16 = 7;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,pcVar23,lVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          plVar21 = (long *)std::ostream::operator<<
                                      ((ostream *)poVar20,
                                       (local_400.
                                        super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->priority_);
          std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
          std::ostream::put((char)plVar21);
          std::ostream::flush();
          if (local_400.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_400.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          peVar22 = *(element_type **)peVar22;
        } while (peVar22 != (element_type *)(local_3c8._48_8_ + 0x38));
      }
      poVar20 = (ostream *)(local_340 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"my id: ",7);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar20,this->id_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
      pcVar23 = "voting_member";
      bVar25 = this->im_learner_ != false;
      if (bVar25) {
        pcVar23 = "learner";
      }
      lVar16 = 0xd;
      if (bVar25) {
        lVar16 = 7;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar23,lVar16);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
      std::ostream::put((char)poVar19);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"num peers: ",0xb);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
      std::ostream::put((char)poVar20);
      std::ostream::flush();
      peVar22 = (local_430->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar22 != (element_type *)0x0) {
        iVar12 = (**(code **)(*(long *)peVar22 + 0x38))();
        if (3 < iVar12) {
          peVar22 = (local_430->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          std::__cxx11::stringbuf::str();
          msg_if_given_abi_cxx11_
                    ((string *)&local_428,"%s",CONCAT44(local_3c8._20_4_,local_3c8._16_4_));
          (**(code **)(*(long *)peVar22 + 0x40))
                    (peVar22,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"raft_server",0x101,&local_428);
          if ((code **)local_428._M_unused._0_8_ != &local_418) {
            operator_delete(local_428._M_unused._M_object);
          }
          if ((undefined1 *)CONCAT44(local_3c8._20_4_,local_3c8._16_4_) != local_3c8 + 0x20) {
            operator_delete((undefined1 *)CONCAT44(local_3c8._20_4_,local_3c8._16_4_));
          }
        }
      }
      if (local_3f0->start_server_in_constructor_ == true) {
        start_server(this,local_3f0->skip_initial_election_timeout_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      std::ios_base::~ios_base(aiStack_2c0);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      if (local_390._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_390._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_);
      }
      return;
    }
    peVar9 = (ppVar2->super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar9->_vptr_log_store[10])(&local_428,peVar9,uVar24);
    if (local_428._M_unused._M_function_pointer[8] == (_func_void)0x2) {
      peVar22 = (local_430->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar22 != (element_type *)0x0) {
        iVar12 = (**(code **)(*(long *)peVar22 + 0x38))();
        if (3 < iVar12) {
          peVar22 = (local_430->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_340,
                     "detect a configuration change that is not committed yet at index %lu",uVar24);
          (**(code **)(*(long *)peVar22 + 0x40))
                    (peVar22,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"raft_server",0xca,local_340);
          if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
            operator_delete((void *)local_340._0_8_);
          }
        }
      }
      this->config_changing_ = true;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
      }
      goto LAB_001ac4ce;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
    }
    uVar24 = uVar24 + 1;
  } while( true );
}

Assistant:

raft_server::raft_server(context* ctx, const init_options& opt)
    : bg_append_ea_(nullptr)
    , initialized_(false)
    , leader_(-1)
    , id_(ctx->state_mgr_->server_id())
    , target_priority_(srv_config::INIT_PRIORITY)
    , votes_responded_(0)
    , votes_granted_(0)
    , leader_commit_index_(0)
    , quick_commit_index_(ctx->state_machine_->last_commit_index())
    , sm_commit_index_(ctx->state_machine_->last_commit_index())
    , initial_commit_index_(ctx->state_machine_->last_commit_index())
    , hb_alive_(false)
    , election_completed_(true)
    , config_changing_(false)
    , catching_up_(false)
    , out_of_log_range_(false)
    , data_fresh_(false)
    , stopping_(false)
    , commit_bg_stopped_(false)
    , append_bg_stopped_(false)
    , write_paused_(false)
    , sm_commit_paused_(false)
    , sm_commit_exec_in_progress_(false)
    , ea_sm_commit_exec_in_progress_(new EventAwaiter())
    , next_leader_candidate_(-1)
    , im_learner_(false)
    , serving_req_(false)
    , steps_to_down_(0)
    , snp_in_progress_(false)
    , ctx_(ctx)
    , scheduler_(ctx->scheduler_)
    , election_exec_(std::bind(&raft_server::handle_election_timeout, this))
    , election_task_(nullptr)
    , role_(srv_role::follower)
    , state_(ctx->state_mgr_->read_state())
    , log_store_(ctx->state_mgr_->load_log_store())
    , state_machine_(ctx->state_machine_)
    , receiving_snapshot_(false)
    , et_cnt_receiving_snapshot_(0)
    , first_snapshot_distance_(0)
    , l_(ctx->logger_)
    , stale_config_(nullptr)
    , config_(ctx->state_mgr_->load_config())
    , uncommitted_config_(nullptr)
    , srv_to_join_(nullptr)
    , srv_to_join_snp_retry_required_(false)
    , srv_to_leave_(nullptr)
    , srv_to_leave_target_idx_(0)
    , conf_to_add_(nullptr)
    , resp_handler_( (rpc_handler)std::bind( &raft_server::handle_peer_resp,
                                             this,
                                             std::placeholders::_1,
                                             std::placeholders::_2 ) )
    , ex_resp_handler_( (rpc_handler)std::bind( &raft_server::handle_ext_resp,
                                                this,
                                                std::placeholders::_1,
                                                std::placeholders::_2 ) )
    , last_snapshot_(ctx->state_machine_->last_snapshot())
    , ea_follower_log_append_(new EventAwaiter())
    , test_mode_flag_(opt.test_mode_flag_)
{
    if (opt.raft_callback_) {
        ctx->set_cb_func(opt.raft_callback_);
    }

    ptr<raft_params> params = ctx_->get_params();
    if (params->stale_log_gap_ < params->fresh_log_gap_) {
        params->stale_log_gap_ = params->fresh_log_gap_;
    }
    if (params->enable_randomized_snapshot_creation_ &&
        !get_last_snapshot() &&
        params->snapshot_distance_ > 1) {
        uint64_t seed = timer_helper::get_timeofday_us() * id_;

        // Flip the integer.
        auto* first = reinterpret_cast<uint8_t*>(&seed);
        auto* last = reinterpret_cast<uint8_t*>(&seed) + sizeof(seed);
        while ((first != last) && (first != -- last)) std::swap(*first++, *last);

        std::default_random_engine engine(seed);
        std::uniform_int_distribution<int32>
            distribution( params->snapshot_distance_ / 2,
                          std::max( params->snapshot_distance_ / 2,
                                    params->snapshot_distance_ - 1 ) );

        first_snapshot_distance_ = distribution(engine);
        p_in("First snapshot creation log distance %u", first_snapshot_distance_);
    }

    apply_and_log_current_params();
    update_rand_timeout();
    precommit_index_ = log_store_->next_slot() - 1;
    lagging_sm_target_index_ = log_store_->next_slot() - 1;

    if (!state_) {
        state_ = cs_new<srv_state>();
        state_->set_term(0);
        state_->set_voted_for(-1);
    }
    vote_init_timer_term_ = state_->get_term();

    ptr<cluster_config> c_conf = get_config();
    std::stringstream init_msg;
    init_msg << "   === INIT RAFT SERVER ===\n"
             << "commit index " << sm_commit_index_ << "\n"
             << "term " << state_->get_term() << "\n"
             << "election timer " << ( state_->is_election_timer_allowed()
                                       ? "allowed" : "not allowed" ) << "\n"
             << "log store start " << log_store_->start_index()
             << ", end " << log_store_->next_slot() - 1 << "\n"
             << "config log idx " << c_conf->get_log_idx()
             << ", prev log idx " << c_conf->get_prev_log_idx() << "\n";
    if (c_conf->is_async_replication()) {
        init_msg << " -- ASYNC REPLICATION --\n";
    }
    p_in("%s", init_msg.str().c_str());

    /**
     * I found this implementation is also a victim of bug
     *     https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E
     * As the implementation is based on Diego's thesis
     *
     * Fix:
     * We should never load configurations that is not committed,
     * this prevents an old server from replicating an obsoleted config to
     * other servers.
     *
     * The prove is as below:
     * Assume S0 is the last committed server set for the old server A
     * |- EXITS Log l which has been committed but l !BELONGS TO A.logs
     *     =>  Vote(A) < Majority(S0)
     * In other words, we need to prove that A cannot be elected to leader
     * if any logs/configs has been committed.
     *
     * Case #1, There is no configuration change since S0, then it's
     *          obvious that
     *          Vote(A) < Majority(S0), see the core Algorithm.
     * Case #2, There are one or more configuration changes since S0,
     *          then at the time of first configuration change was
     *          committed, there are at least Majority(S0 - 1) servers
     *          committed the configuration change
     *          Majority(S0 - 1) + Majority(S0) > S0 => Vote(A) < Majority(S0)
     * -|
     */
    for ( ulong i = std::max( sm_commit_index_ + 1,
                              log_store_->start_index() );
          i < log_store_->next_slot();
          ++i ) {
        auto const entry = log_store_->entry_at(i);
        if (entry->get_val_type() == log_val_type::conf) {
            p_in( "detect a configuration change "
                  "that is not committed yet at index %" PRIu64 "", i );
            config_changing_ = true;
            break;
        }
    }

    std::stringstream peer_info_msg;
    auto srvs_end = c_conf->get_servers().end();
    for (auto it = c_conf->get_servers().begin(); it != srvs_end; ++it) {
        ptr<srv_config> cur_srv = *it;
        if (cur_srv->get_id() != id_) {
            timer_task<int32>::executor exec =
                (timer_task<int32>::executor)
                std::bind( &raft_server::handle_hb_timeout,
                           this,
                           std::placeholders::_1 );
            peers_.insert( std::make_pair
                           ( cur_srv->get_id(),
                             cs_new< peer,
                                     ptr<srv_config>&,
                                     context&,
                                     timer_task<int32>::executor&,
                                     ptr<logger>& >
                                   ( cur_srv, *ctx_, exec, l_ ) ) );
        } else {
            // Myself.
            im_learner_ = cur_srv->is_learner();
            my_priority_ = cur_srv->get_priority();
        }

        // WARNING:
        //   We should set the initial target priority to 1.
        //   When multiple nodes are gone at the same time and
        //   then re-started, and if some nodes cannot decay the
        //   target priority, we can never elect new leader.
        //
        //   (The reason why some nodes cannot decay is because
        //    request vote message resets election timer.)
        //
        // target_priority_ = std::max( target_priority_,
        //                              cur_srv->get_priority() );

        peer_info_msg
            << "peer " << cur_srv->get_id()
            << ": DC ID " << cur_srv->get_dc_id()
            << ", " << cur_srv->get_endpoint()
            << ", " << (cur_srv->is_learner() ? "learner" : "voting member")
            << ", " << cur_srv->get_priority()
            << std::endl;
    }

    peer_info_msg << "my id: " << id_
                  << ", " << ((im_learner_) ? "learner" : "voting_member")
                  << std::endl;
    peer_info_msg << "num peers: " << peers_.size() << std::endl;
    p_in("%s", peer_info_msg.str().c_str());

    if (opt.start_server_in_constructor_) {
        start_server(opt.skip_initial_election_timeout_);
    }
}